

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
MiniScript::ListStorage<MiniScript::TACLine>::ListStorage
          (ListStorage<MiniScript::TACLine> *this,long slots)

{
  (this->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__RefCountedStorage_00166670;
  (this->super_RefCountedStorage).refCount = 1;
  SimpleVector<MiniScript::TACLine>::SimpleVector
            (&this->super_SimpleVector<MiniScript::TACLine>,slots);
  (this->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)&PTR__ListStorage_00166400
  ;
  return;
}

Assistant:

ListStorage(long slots) : SimpleVector<T>(slots) {}